

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeStiffnessMatrix(ChElementHexaCorot_8 *this)

{
  pointer ppCVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  ChGaussPoint *pCVar4;
  ChMatrixDynamic<> *pCVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  pointer ppCVar9;
  Matrix<double,__1,__1,_1,__1,__1> *dst;
  pointer ppCVar10;
  ulong uVar11;
  char *__function;
  size_t in_RSI;
  Index index;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ActualDstType actualDst;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double Jdet;
  ChMatrixDynamic<> BT;
  assign_op<double,_double> local_b1;
  double local_b0;
  Matrix<double,__1,__1,_1,__1,__1> local_a8;
  long local_88 [3];
  ChMatrixDynamic<> *local_70;
  variable_if_dynamic<long,__1> local_68;
  variable_if_dynamic<long,__1> local_60;
  scalar_constant_op<double> local_58;
  Matrix<double,__1,__1,_1,__1,__1> *local_50;
  ChMatrixDynamic<> *local_48;
  ChMatrixDynamic<> *local_40;
  
  dst = (Matrix<double,__1,__1,_1,__1,__1> *)
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator_new
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)0x18,in_RSI);
  uVar14 = 0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols = 0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data =
       (double *)0x0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows = 0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  this->Volume = 0.0;
  ppCVar10 = (this->GpVector).
             super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->GpVector).
      super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar10) {
    do {
      (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xe])
                (this,ppCVar10[uVar14],&local_b0);
      local_70 = (this->GpVector).
                 super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14]->MatrB;
      Eigen::internal::
      check_for_aliasing<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
                (&local_a8,(Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_70);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                (&local_a8,(Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_70,
                 (assign_op<double,_double> *)local_88);
      peVar3 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
          != (peVar3->StressStrainMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows) {
        __function = 
        "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
LAB_006afdaa:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
      }
      pCVar4 = (this->GpVector).
               super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14];
      pCVar5 = pCVar4->MatrB;
      if ((peVar3->StressStrainMatrix).
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
          (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
          m_rows) {
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
        goto LAB_006afdaa;
      }
      uVar12 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_cols;
      if ((long)(uVar12 | local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                          m_storage.m_rows) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
                     );
      }
      local_48 = &peVar3->StressStrainMatrix;
      local_58.m_other = local_b0 * pCVar4->m_weight;
      local_68.m_value =
           local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
      local_50 = &local_a8;
      local_88[2] = 0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_60.m_value = uVar12;
      local_40 = pCVar5;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,__1,_1,__1,__1> *)local_88,(SrcXprType *)&local_70,&local_b1);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                (dst,(Matrix<double,__1,__1,_1,__1,__1> *)local_88,&local_b1);
      if (local_88[0] != 0) {
        free(*(void **)(local_88[0] + -8));
      }
      lVar13 = (this->StiffnessMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
      if ((lVar13 != (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                     m_storage.m_rows) ||
         (lVar6 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols,
         lVar6 != (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                  m_cols)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      uVar11 = lVar6 * lVar13;
      pdVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_data;
      pdVar8 = (this->StiffnessMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
      uVar12 = uVar11 + 7;
      if (-1 < (long)uVar11) {
        uVar12 = uVar11;
      }
      uVar12 = uVar12 & 0xfffffffffffffff8;
      if (7 < (long)uVar11) {
        lVar13 = 0;
        do {
          auVar15 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar7 + lVar13),
                                   *(undefined1 (*) [64])(pdVar8 + lVar13));
          *(undefined1 (*) [64])(pdVar8 + lVar13) = auVar15;
          lVar13 = lVar13 + 8;
        } while (lVar13 < (long)uVar12);
      }
      if ((long)uVar12 < (long)uVar11) {
        do {
          pdVar8[uVar12] = pdVar7[uVar12] + pdVar8[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 - uVar12 != 0);
      }
      ppCVar10 = (this->GpVector).
                 super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_b0;
      ppCVar9 = (this->GpVector).
                super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppCVar1 = ppCVar10 + uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (*ppCVar1)->m_weight;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->Volume;
      auVar2 = vfmadd213sd_fma(auVar17,auVar16,auVar2);
      this->Volume = auVar2._0_8_;
    } while (uVar14 < (ulong)((long)ppCVar9 - (long)ppCVar10 >> 3));
    pdVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    if (pdVar7 != (double *)0x0) {
      free((void *)pdVar7[-1]);
    }
  }
  free(dst);
  if (local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                 .m_data[-1]);
  }
  return;
}

Assistant:

void ChElementHexaCorot_8::ComputeStiffnessMatrix() {
    double Jdet;
    ChMatrixDynamic<>* temp = new ChMatrixDynamic<>;
    ChMatrixDynamic<> BT;
    this->Volume = 0;

    for (unsigned int i = 0; i < GpVector.size(); i++) {
        ComputeMatrB(GpVector[i], Jdet);
        BT = GpVector[i]->MatrB->transpose();
        *temp = (Jdet * GpVector[i]->GetWeight()) * (BT * Material->Get_StressStrainMatrix() * *(GpVector[i]->MatrB));
        StiffnessMatrix += *temp;

        // by the way also computes volume:
        this->Volume += GpVector[i]->GetWeight() * Jdet;
    }

    delete temp;
}